

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FieldDescriptor::legacy_enum_field_treated_as_closed(FieldDescriptor *this)

{
  bool bVar1;
  Type TVar2;
  FeatureSet *this_00;
  ConstType this_01;
  EnumDescriptor *this_02;
  bool local_21;
  bool local_11;
  FieldDescriptor *this_local;
  
  TVar2 = type(this);
  local_11 = false;
  if (TVar2 == TYPE_ENUM) {
    this_00 = features(this);
    this_01 = FeatureSet::
              GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                        (this_00,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                                  *)pb::cpp);
    bVar1 = pb::CppFeatures::legacy_closed_enum(this_01);
    local_21 = true;
    if (!bVar1) {
      this_02 = enum_type(this);
      local_21 = EnumDescriptor::is_closed(this_02);
    }
    local_11 = local_21;
  }
  return local_11;
}

Assistant:

bool FieldDescriptor::legacy_enum_field_treated_as_closed() const {
  return type() == TYPE_ENUM &&
         (features().GetExtension(pb::cpp).legacy_closed_enum() ||
          enum_type()->is_closed());
}